

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O3

void __thiscall webrtc::WavWriter::Close(WavWriter *this)

{
  string *result;
  int line;
  uint8_t header [44];
  uint local_1bc;
  int local_1b8 [12];
  FatalMessage local_188;
  
  local_1b8[0] = fseek((FILE *)this->file_handle_,0,0);
  local_188._0_8_ = (ulong)(uint)local_188._4_4_ << 0x20;
  if (local_1b8[0] != 0) {
    result = rtc::MakeCheckOpString<int,int>
                       ((int *)&local_188,local_1b8,"0 == fseek(file_handle_, 0, 0)");
    if (result != (string *)0x0) {
      line = 0xa7;
      goto LAB_0014e259;
    }
  }
  WriteWavHeader((uint8_t *)local_1b8,this->num_channels_,this->sample_rate_,kWavFormatPcm,2,
                 this->num_samples_);
  local_1bc = 1;
  local_188._0_8_ = fwrite(local_1b8,0x2c,1,(FILE *)this->file_handle_);
  if (local_188._0_8_ != 1) {
    result = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                       (&local_1bc,(unsigned_long *)&local_188,
                        "1u == fwrite(header, kWavHeaderSize, 1, file_handle_)");
    if (result != (string *)0x0) {
      line = 0xab;
      goto LAB_0014e259;
    }
  }
  local_1bc = fclose((FILE *)this->file_handle_);
  local_188._0_8_ = local_188._0_8_ & 0xffffffff00000000;
  if (local_1bc != 0) {
    result = rtc::MakeCheckOpString<int,int>
                       ((int *)&local_188,(int *)&local_1bc,"0 == fclose(file_handle_)");
    if (result != (string *)0x0) {
      line = 0xac;
LAB_0014e259:
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&local_188);
    }
  }
  this->file_handle_ = (FILE *)0x0;
  return;
}

Assistant:

void WavWriter::Close() {
  RTC_CHECK_EQ(0, fseek(file_handle_, 0, SEEK_SET));
  uint8_t header[kWavHeaderSize];
  WriteWavHeader(header, num_channels_, sample_rate_, kWavFormat,
                 kBytesPerSample, num_samples_);
  RTC_CHECK_EQ(1u, fwrite(header, kWavHeaderSize, 1, file_handle_));
  RTC_CHECK_EQ(0, fclose(file_handle_));
  file_handle_ = NULL;
}